

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_symtab.c
# Opt level: O2

void lj_symtab_dump_trace(lj_wbuf *out,GCtrace *trace)

{
  BCLine BVar1;
  GCproto *pt;
  
  pt = (GCproto *)(ulong)(trace->startpt).gcptr32;
  BVar1 = lj_debug_line(pt,(BCPos)(((ulong)(trace->startpc).ptr32 - (long)pt) - 0x40 >> 2));
  lj_wbuf_addu64(out,(ulong)trace->traceno);
  lj_wbuf_addu64(out,(uint64_t)pt);
  lj_wbuf_addu64(out,(long)BVar1);
  return;
}

Assistant:

void lj_symtab_dump_trace(struct lj_wbuf *out, const GCtrace *trace)
{
  GCproto *pt = &gcref(trace->startpt)->pt;
  BCLine lineno = 0;

  const BCIns *startpc = mref(trace->startpc, const BCIns);
  lj_assertX(startpc >= proto_bc(pt) && startpc < proto_bc(pt) + pt->sizebc,
	     "start trace PC out of range");

  lineno = lj_debug_line(pt, proto_bcpos(pt, startpc));

  lj_wbuf_addu64(out, (uint64_t)trace->traceno);
  /*
  ** The information about the prototype, associated with the
  ** trace's start has already been dumped, as it is anchored
  ** via the trace and is not collected while the trace is alive.
  ** For this reason, we do not need to repeat dumping the chunk
  ** name for the prototype.
  */
  lj_wbuf_addu64(out, (uintptr_t)pt);
  lj_wbuf_addu64(out, (uint64_t)lineno);
}